

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

int * Llb_MtrFindVarOrder(Llb_Mtr_t *p)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int *piVar7;
  void *__ptr;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  size_t __nmemb;
  
  iVar2 = p->nRows;
  __nmemb = (size_t)iVar2;
  piVar7 = (int *)calloc(__nmemb,4);
  __ptr = calloc(__nmemb,4);
  if (0 < (long)__nmemb) {
    uVar3 = p->nCols;
    sVar8 = 0;
    do {
      piVar7[sVar8] = (int)sVar8;
      uVar9 = uVar3;
      uVar10 = (ulong)uVar3;
      do {
        uVar10 = uVar10 - 1;
        if ((int)uVar9 < 1) goto LAB_007cb62f;
        uVar9 = uVar9 - 1;
      } while (p->pMatrix[uVar10][sVar8] == '\0');
      *(uint *)((long)__ptr + sVar8 * 4) = uVar9;
LAB_007cb62f:
      sVar8 = sVar8 + 1;
    } while (sVar8 != __nmemb);
  }
  if (1 < iVar2) {
    do {
      uVar10 = 0;
      bVar6 = false;
      do {
        iVar4 = *(int *)((long)__ptr + uVar10 * 4);
        iVar5 = *(int *)((long)__ptr + uVar10 * 4 + 4);
        if (iVar5 < iVar4) {
          puVar1 = (ulong *)(piVar7 + uVar10);
          *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
          *(int *)((long)__ptr + uVar10 * 4) = iVar5;
          *(int *)((long)__ptr + uVar10 * 4 + 4) = iVar4;
          bVar6 = true;
        }
        uVar10 = uVar10 + 1;
      } while (iVar2 - 1 != uVar10);
    } while ((bVar6) && (1 < iVar2));
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return piVar7;
}

Assistant:

int * Llb_MtrFindVarOrder( Llb_Mtr_t * p )
{
    int * pOrder, * pLast;
    int i, k, fChanges, Temp;
    pOrder = ABC_CALLOC( int, p->nRows );
    pLast  = ABC_CALLOC( int, p->nRows );
    for ( i = 0; i < p->nRows; i++ )
    {
        pOrder[i] = i;
        for ( k = p->nCols - 1; k >= 0; k-- )
            if ( p->pMatrix[k][i] )
            {
                pLast[i] = k;
                break;
            }
    }
    do
    {
        fChanges = 0;
        for ( i = 0; i < p->nRows - 1; i++ )
            if ( pLast[i] > pLast[i+1] )
            {
                Temp = pOrder[i];
                pOrder[i] = pOrder[i+1];
                pOrder[i+1] = Temp;

                Temp = pLast[i];
                pLast[i] = pLast[i+1];
                pLast[i+1] = Temp;

                fChanges = 1;
            }
    }
    while ( fChanges );
    ABC_FREE( pLast );
    return pOrder;
}